

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

void Intra4Preds_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined1 uVar7;
  unkuint10 Var8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  uint8_t uVar17;
  int iVar18;
  uint uVar19;
  uint8_t *puVar20;
  long lVar21;
  uint8_t uVar22;
  uint uVar23;
  uint8_t uVar24;
  uint uVar25;
  int I;
  uint uVar26;
  uint uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  short sVar33;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar40;
  __m128i ABCD0;
  undefined1 auVar43 [16];
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar53;
  undefined1 uVar55;
  undefined1 uVar57;
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 uVar54;
  undefined1 uVar56;
  undefined1 uVar58;
  undefined1 auVar52 [16];
  __m128i ABCDEFGH;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 uVar63;
  undefined4 uVar65;
  undefined1 uVar69;
  undefined1 auVar66 [16];
  int iVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined5 uVar41;
  undefined6 uVar42;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  int iVar64;
  undefined1 auVar67 [16];
  undefined1 uVar68;
  undefined1 uVar74;
  undefined1 uVar75;
  
  uVar40 = *(undefined4 *)top;
  uVar1 = (ulong)(ushort)uVar40 & 0xffffffffffff00ff;
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = (char)((uint)uVar40 >> 0x18);
  auVar10[8] = (char)((uint)uVar40 >> 0x10);
  auVar10._0_8_ = uVar1;
  auVar10[9] = 0;
  auVar10._10_3_ = auVar9._10_3_;
  auVar15._5_8_ = 0;
  auVar15._0_5_ = auVar10._8_5_;
  auVar11[4] = (char)((uint)uVar40 >> 8);
  auVar11._0_4_ = (int)uVar1;
  auVar11[5] = 0;
  auVar11._6_7_ = SUB137(auVar15 << 0x40,6);
  uVar40 = *(undefined4 *)(top + -5);
  uVar6 = (ulong)(ushort)uVar40 & 0xffffffffffff00ff;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar6;
  auVar12[0xc] = (char)((uint)uVar40 >> 0x18);
  auVar13[8] = (char)((uint)uVar40 >> 0x10);
  auVar13._0_8_ = uVar6;
  auVar13[9] = 0;
  auVar13._10_3_ = auVar12._10_3_;
  auVar16._5_8_ = 0;
  auVar16._0_5_ = auVar13._8_5_;
  auVar14[4] = (char)((uint)uVar40 >> 8);
  auVar14._0_4_ = (int)uVar6;
  auVar14[5] = 0;
  auVar14._6_7_ = SUB137(auVar16 << 0x40,6);
  iVar18 = ((uint)(uint3)(auVar12._10_3_ >> 0x10) + (uint)(uint3)(auVar9._10_3_ >> 0x10) +
            auVar14._4_4_ + auVar11._4_4_ +
            auVar13._8_4_ + auVar10._8_4_ + (int)uVar6 + (int)uVar1 + 4 >> 3 & 0xff) * 0x1010101;
  *(int *)(dst + 0x600) = iVar18;
  *(int *)(dst + 0x620) = iVar18;
  *(int *)(dst + 0x640) = iVar18;
  *(int *)(dst + 0x660) = iVar18;
  puVar20 = dst + 0x604;
  uVar40 = *(undefined4 *)top;
  bVar3 = top[-1];
  lVar21 = 4;
  do {
    auVar34 = pshuflw(ZEXT416((uint)top[lVar21 + -6] - (uint)bVar3),
                      ZEXT416((uint)top[lVar21 + -6] - (uint)bVar3),0);
    sVar33 = auVar34._0_2_ + ((ushort)uVar40 & 0xff);
    sVar37 = auVar34._2_2_ + (ushort)(byte)((uint)uVar40 >> 8);
    sVar38 = auVar34._4_2_ + (ushort)(byte)((uint)uVar40 >> 0x10);
    sVar39 = auVar34._6_2_ + (ushort)(byte)((uint)uVar40 >> 0x18);
    *(uint *)puVar20 =
         CONCAT13((0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39),
                  CONCAT12((0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38),
                           CONCAT11((0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37)
                                    ,(0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 -
                                     (0xff < sVar33))));
    puVar20 = puVar20 + 0x20;
    lVar21 = lVar21 + -1;
  } while (lVar21 != 0);
  uVar5 = *(undefined8 *)(top + -1);
  uVar1 = *(ulong *)(top + -1);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar1;
  auVar72._0_8_ = uVar1 >> 8;
  auVar72._8_8_ = 0;
  uVar25 = (uint)uVar5;
  auVar51._8_4_ = uVar25;
  auVar51._0_8_ = uVar5;
  auVar51._12_4_ = (int)((ulong)uVar5 >> 0x20);
  uVar74 = (undefined1)uVar1;
  auVar49[0] = pavgb(uVar74,(char)((ulong)uVar5 >> 0x10));
  uVar75 = (undefined1)(uVar1 >> 8);
  auVar49[1] = pavgb(uVar75,(char)((ulong)uVar5 >> 0x18));
  uVar63 = (undefined1)((ulong)uVar5 >> 0x20);
  uVar44 = (undefined1)(uVar1 >> 0x10);
  auVar49[2] = pavgb(uVar44,uVar63);
  uVar45 = (undefined1)(uVar1 >> 0x18);
  auVar49[3] = pavgb(uVar45,(char)((ulong)uVar5 >> 0x28));
  uVar46 = (undefined1)(uVar1 >> 0x20);
  auVar49[4] = pavgb(uVar46,(char)((ulong)uVar5 >> 0x30));
  uVar48 = (undefined1)(uVar1 >> 0x28);
  auVar49[5] = pavgb(uVar48,(char)((ulong)uVar5 >> 0x38));
  uVar54 = (undefined1)(uVar1 >> 0x30);
  uVar7 = (undefined1)(uVar1 >> 0x38);
  auVar49[6] = pavgb(uVar54,0);
  auVar49[7] = pavgb(uVar7,0);
  auVar49[8] = pavgb(0,0);
  auVar49[9] = pavgb(0,0);
  auVar49[10] = pavgb(0,0);
  auVar49[0xb] = pavgb(0,0);
  auVar49[0xc] = pavgb(0,0);
  auVar49[0xd] = pavgb(0,0);
  auVar49[0xe] = pavgb(0,0);
  auVar49[0xf] = pavgb(0,0);
  auVar34 = psubusb(auVar49,(auVar51 >> 0x50 ^ auVar34) & _DAT_001b8060);
  uVar47 = pavgb(auVar34[0],uVar75);
  uVar53 = pavgb(auVar34[1],uVar44);
  uVar55 = pavgb(auVar34[2],uVar45);
  uVar57 = pavgb(auVar34[3],uVar46);
  pavgb(auVar34[4],uVar48);
  pavgb(auVar34[5],uVar54);
  pavgb(auVar34[6],uVar7);
  pavgb(auVar34[7],0);
  pavgb(auVar34[8],0);
  pavgb(auVar34[9],0);
  pavgb(auVar34[10],0);
  pavgb(auVar34[0xb],0);
  pavgb(auVar34[0xc],0);
  pavgb(auVar34[0xd],0);
  pavgb(auVar34[0xe],0);
  pavgb(auVar34[0xf],0);
  lVar21 = 0;
  do {
    *(uint *)(dst + lVar21 + 0x608) = CONCAT13(uVar57,CONCAT12(uVar55,CONCAT11(uVar53,uVar47)));
    lVar21 = lVar21 + 0x20;
  } while (lVar21 != 0x80);
  bVar3 = top[-2];
  uVar26 = (uint)bVar3;
  uVar27 = (uint)top[-3];
  uVar19 = (uint)top[-4];
  bVar4 = top[-5];
  uVar23 = uVar27 + (uVar25 & 0xff) + uVar26 * 2 + 2 >> 2;
  *(uint *)(dst + 0x60c) = uVar23 * 0x1010101;
  uVar30 = uVar19 + uVar26 + uVar27 * 2 + 2 >> 2;
  *(uint *)(dst + 0x62c) = uVar30 * 0x1010101;
  iVar18 = uVar27 + uVar19 * 2 + 2;
  *(uint *)(dst + 0x64c) = (iVar18 + (uint)bVar4 >> 2) * 0x1010101;
  uVar2 = *(undefined8 *)(top + -5);
  Var8 = CONCAT28((ushort)((ulong)uVar5 >> 0x20) & 0xff,uVar2);
  *(uint *)(dst + 0x66c) = (uVar19 + (uint)bVar4 * 3 + 2 >> 2) * 0x1010101;
  auVar34 = _DAT_001b8060;
  uVar53 = (undefined1)((ulong)uVar2 >> 0x10);
  auVar50[0] = pavgb(uVar53,(char)uVar2);
  uVar47 = (undefined1)((ulong)uVar2 >> 8);
  uVar55 = (undefined1)((ulong)uVar2 >> 0x18);
  auVar50[1] = pavgb(uVar55,uVar47);
  uVar57 = (undefined1)((ulong)uVar2 >> 0x20);
  auVar50[2] = pavgb(uVar57,uVar53);
  uVar56 = (undefined1)((ulong)uVar2 >> 0x28);
  auVar50[3] = pavgb(uVar56,uVar55);
  uVar58 = (undefined1)((ulong)uVar2 >> 0x30);
  auVar50[4] = pavgb(uVar58,uVar57);
  uVar59 = (undefined1)((ulong)uVar2 >> 0x38);
  auVar50[5] = pavgb(uVar59,uVar56);
  auVar50[6] = pavgb(uVar63,uVar58);
  auVar50[7] = pavgb(0,uVar59);
  auVar50[8] = pavgb(0,uVar63);
  auVar50[9] = pavgb(0,0);
  auVar50[10] = pavgb(0,0);
  auVar50[0xb] = pavgb(0,0);
  auVar50[0xc] = pavgb(0,0);
  auVar50[0xd] = pavgb(0,0);
  auVar50[0xe] = pavgb(0,0);
  auVar50[0xf] = pavgb(0,0);
  auVar61._10_6_ = 0;
  auVar61._0_10_ = Var8 >> 0x10 ^ Var8;
  auVar51 = psubusb(auVar50,auVar61 & _DAT_001b8060);
  uVar47 = pavgb(auVar51[0],uVar47);
  uVar53 = pavgb(auVar51[1],uVar53);
  uVar55 = pavgb(auVar51[2],uVar55);
  uVar57 = pavgb(auVar51[3],uVar57);
  uVar40 = CONCAT13(uVar57,CONCAT12(uVar55,CONCAT11(uVar53,uVar47)));
  uVar47 = pavgb(auVar51[4],uVar56);
  uVar41 = CONCAT14(uVar47,uVar40);
  uVar47 = pavgb(auVar51[5],uVar58);
  uVar42 = CONCAT15(uVar47,uVar41);
  uVar47 = pavgb(auVar51[6],uVar59);
  pavgb(auVar51[7],uVar63);
  pavgb(auVar51[8],0);
  pavgb(auVar51[9],0);
  pavgb(auVar51[10],0);
  pavgb(auVar51[0xb],0);
  pavgb(auVar51[0xc],0);
  pavgb(auVar51[0xd],0);
  pavgb(auVar51[0xe],0);
  pavgb(auVar51[0xf],0);
  uVar63 = pavgb(uVar74,uVar75);
  uVar53 = pavgb(uVar75,uVar44);
  uVar55 = pavgb(uVar44,uVar45);
  uVar57 = pavgb(uVar45,uVar46);
  iVar64 = CONCAT13(uVar57,CONCAT12(uVar55,CONCAT11(uVar53,uVar63)));
  pavgb(uVar46,uVar48);
  pavgb(uVar48,uVar54);
  pavgb(uVar54,uVar7);
  pavgb(uVar7,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  uVar6 = uVar1 & 0xffffffffffff00;
  auVar66._8_8_ = uVar1 >> 0x38;
  auVar66._0_8_ = uVar6 << 8 | (ulong)(ushort)((ushort)(uVar25 << 8) | (ushort)bVar3);
  auVar71[0] = pavgb(bVar3,uVar75);
  auVar71[1] = pavgb((char)uVar5,uVar44);
  auVar71[2] = pavgb((char)(uVar6 >> 8),uVar45);
  auVar71[3] = pavgb((char)(uVar6 >> 0x10),uVar46);
  auVar71[4] = pavgb((char)(uVar6 >> 0x18),uVar48);
  auVar71[5] = pavgb((char)(uVar6 >> 0x20),uVar54);
  auVar71[6] = pavgb((char)(uVar6 >> 0x28),uVar7);
  auVar71[7] = pavgb((char)(uVar6 >> 0x30),0);
  auVar71[8] = pavgb(uVar7,0);
  auVar71[9] = pavgb(0,0);
  auVar71[10] = pavgb(0,0);
  auVar71[0xb] = pavgb(0,0);
  auVar71[0xc] = pavgb(0,0);
  auVar71[0xd] = pavgb(0,0);
  auVar71[0xe] = pavgb(0,0);
  auVar71[0xf] = pavgb(0,0);
  auVar72 = psubusb(auVar71,(auVar66 ^ auVar72) & _DAT_001b8060);
  uVar63 = pavgb(auVar72[0],uVar74);
  uVar74 = pavgb(auVar72[1],uVar75);
  uVar75 = pavgb(auVar72[2],uVar44);
  uVar53 = pavgb(auVar72[3],uVar45);
  iVar70 = CONCAT13(uVar53,CONCAT12(uVar75,CONCAT11(uVar74,uVar63)));
  pavgb(auVar72[4],uVar46);
  pavgb(auVar72[5],uVar48);
  pavgb(auVar72[6],uVar54);
  pavgb(auVar72[7],uVar7);
  pavgb(auVar72[8],0);
  pavgb(auVar72[9],0);
  pavgb(auVar72[10],0);
  pavgb(auVar72[0xb],0);
  pavgb(auVar72[0xc],0);
  pavgb(auVar72[0xd],0);
  pavgb(auVar72[0xe],0);
  pavgb(auVar72[0xf],0);
  *(ulong *)(dst + 0x610) = CONCAT44(iVar64,(int)(CONCAT16(uVar47,uVar42) >> 0x18));
  *(ulong *)(dst + 0x630) = CONCAT44(iVar70,(int)((uint6)uVar42 >> 0x10));
  *(ulong *)(dst + 0x650) = CONCAT44(iVar64 << 8,(int)((uint5)uVar41 >> 8));
  *(ulong *)(dst + 0x670) = CONCAT44(iVar70 << 8,uVar40);
  dst[0x654] = (uint8_t)uVar23;
  uVar29 = (uint8_t)(uVar26 + uVar19 + 2 + uVar27 * 2 >> 2);
  dst[0x674] = uVar29;
  uVar6 = *(ulong *)top;
  uVar1 = *(ulong *)top;
  auVar35._0_8_ = uVar1 >> 8;
  auVar35._8_8_ = 0;
  auVar62._8_4_ = (uint)uVar6;
  auVar62._0_8_ = uVar6;
  auVar62._12_4_ = (int)(uVar6 >> 0x20);
  uVar48 = (undefined1)(uVar6 >> 0x10);
  auVar43[0] = pavgb((char)uVar1,uVar48);
  uVar74 = (undefined1)(uVar1 >> 8);
  uVar54 = (undefined1)(uVar6 >> 0x18);
  auVar43[1] = pavgb(uVar74,uVar54);
  uVar75 = (undefined1)(uVar1 >> 0x10);
  uVar56 = (undefined1)(uVar6 >> 0x20);
  auVar43[2] = pavgb(uVar75,uVar56);
  uVar44 = (undefined1)(uVar1 >> 0x18);
  uVar58 = (undefined1)(uVar6 >> 0x28);
  auVar43[3] = pavgb(uVar44,uVar58);
  uVar45 = (undefined1)(uVar1 >> 0x20);
  uVar59 = (undefined1)(uVar6 >> 0x30);
  auVar43[4] = pavgb(uVar45,uVar59);
  uVar57 = (undefined1)(uVar1 >> 0x28);
  uVar60 = (undefined1)(uVar6 >> 0x38);
  auVar43[5] = pavgb(uVar57,uVar60);
  uVar46 = (undefined1)(uVar1 >> 0x30);
  uVar7 = (undefined1)(uVar1 >> 0x38);
  auVar43[6] = pavgb(uVar46,uVar60);
  auVar43[7] = pavgb(uVar7,0);
  auVar43[8] = pavgb(0,0);
  auVar43[9] = pavgb(0,0);
  auVar43[10] = pavgb(0,0);
  auVar43[0xb] = pavgb(0,0);
  auVar43[0xc] = pavgb(0,0);
  auVar43[0xd] = pavgb(0,0);
  auVar43[0xe] = pavgb(0,0);
  auVar43[0xf] = pavgb(0,0);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = (auVar62._8_8_ >> 0x10 | (uVar6 >> 0x38) << 0x30) ^ uVar1;
  auVar72 = psubusb(auVar43,auVar52 & auVar34);
  uVar63 = pavgb(auVar72[0],uVar74);
  uVar47 = pavgb(auVar72[1],uVar75);
  uVar53 = pavgb(auVar72[2],uVar44);
  uVar55 = pavgb(auVar72[3],uVar45);
  uVar40 = CONCAT13(uVar55,CONCAT12(uVar53,CONCAT11(uVar47,uVar63)));
  uVar63 = pavgb(auVar72[4],uVar57);
  uVar41 = CONCAT14(uVar63,uVar40);
  uVar63 = pavgb(auVar72[5],uVar46);
  uVar42 = CONCAT15(uVar63,uVar41);
  uVar63 = pavgb(auVar72[6],uVar7);
  pavgb(auVar72[7],0);
  pavgb(auVar72[8],0);
  pavgb(auVar72[9],0);
  pavgb(auVar72[10],0);
  pavgb(auVar72[0xb],0);
  pavgb(auVar72[0xc],0);
  pavgb(auVar72[0xd],0);
  pavgb(auVar72[0xe],0);
  pavgb(auVar72[0xf],0);
  uVar47 = pavgb((char)uVar1,uVar74);
  uVar53 = pavgb(uVar74,uVar75);
  uVar55 = pavgb(uVar75,uVar44);
  uVar68 = pavgb(uVar44,uVar45);
  uVar65 = CONCAT13(uVar68,CONCAT12(uVar55,CONCAT11(uVar53,uVar47)));
  uVar69 = pavgb(uVar45,uVar57);
  auVar67._0_5_ = CONCAT14(uVar69,uVar65);
  auVar67[5] = pavgb(uVar57,uVar46);
  auVar67[6] = pavgb(uVar46,uVar7);
  auVar67[7] = pavgb(uVar7,0);
  auVar67[8] = pavgb(0,0);
  auVar67[9] = pavgb(0,0);
  auVar67[10] = pavgb(0,0);
  auVar67[0xb] = pavgb(0,0);
  auVar67[0xc] = pavgb(0,0);
  auVar67[0xd] = pavgb(0,0);
  auVar67[0xe] = pavgb(0,0);
  auVar67[0xf] = pavgb(0,0);
  auVar73[0] = pavgb(uVar48,uVar74);
  auVar73[1] = pavgb(uVar54,uVar75);
  auVar73[2] = pavgb(uVar56,uVar44);
  auVar73[3] = pavgb(uVar58,uVar45);
  auVar73[4] = pavgb(uVar59,uVar57);
  auVar73[5] = pavgb(uVar60,uVar46);
  auVar73[6] = pavgb(0,uVar7);
  auVar73[7] = pavgb(0,0);
  auVar73[8] = pavgb(0,0);
  auVar73[9] = pavgb(0,0);
  auVar73[10] = pavgb(0,0);
  auVar73[0xb] = pavgb(0,0);
  auVar73[0xc] = pavgb(0,0);
  auVar73[0xd] = pavgb(0,0);
  auVar73[0xe] = pavgb(0,0);
  auVar73[0xf] = pavgb(0,0);
  auVar76[0] = pavgb(uVar47,auVar73[0]);
  auVar76[1] = pavgb(uVar53,auVar73[1]);
  auVar76[2] = pavgb(uVar55,auVar73[2]);
  auVar76[3] = pavgb(uVar68,auVar73[3]);
  auVar76[4] = pavgb(uVar69,auVar73[4]);
  auVar76[5] = pavgb(auVar67[5],auVar73[5]);
  auVar76[6] = pavgb(auVar67[6],auVar73[6]);
  auVar76[7] = pavgb(auVar67[7],auVar73[7]);
  auVar76[8] = pavgb(auVar67[8],auVar73[8]);
  auVar76[9] = pavgb(auVar67[9],auVar73[9]);
  auVar76[10] = pavgb(auVar67[10],auVar73[10]);
  auVar76[0xb] = pavgb(auVar67[0xb],auVar73[0xb]);
  auVar76[0xc] = pavgb(auVar67[0xc],auVar73[0xc]);
  auVar76[0xd] = pavgb(auVar67[0xd],auVar73[0xd]);
  auVar76[0xe] = pavgb(auVar67[0xe],auVar73[0xe]);
  auVar76[0xf] = pavgb(auVar67[0xf],auVar73[0xf]);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar35._0_8_ ^ uVar1;
  auVar34 = psubusb(auVar76,(auVar36 | auVar62 >> 0x50 ^ auVar35) & (auVar73 ^ auVar67) & auVar34);
  *(ulong *)(dst + 0x618) = CONCAT44(uVar65,uVar40);
  *(ulong *)(dst + 0x638) = CONCAT44(auVar34._0_4_,(int)((uint5)uVar41 >> 8));
  *(ulong *)(dst + 0x658) = CONCAT44((int)((uint5)auVar67._0_5_ >> 8),(int)((uint6)uVar42 >> 0x10));
  *(ulong *)(dst + 0x678) = CONCAT44(auVar34._1_4_,(int)(CONCAT16(uVar63,uVar42) >> 0x18));
  dst[0x65f] = auVar34[4];
  dst[0x67f] = auVar34[5];
  uVar31 = (uint)top[-1];
  bVar3 = top[-5];
  uVar25 = (uint)bVar3;
  uVar32 = (uint)uVar6 & 0xff;
  uVar23 = (uint)(uVar6 >> 8) & 0xff;
  uVar17 = (uint8_t)(uVar26 + uVar31 + 1 >> 1);
  dst[0x6a2] = uVar17;
  dst[0x680] = uVar17;
  uVar28 = (uint8_t)(uVar27 + uVar26 + 1 >> 1);
  dst[0x6c2] = uVar28;
  dst[0x6a0] = uVar28;
  uVar24 = (uint8_t)(uVar27 + uVar19 + 1 >> 1);
  dst[0x6e2] = uVar24;
  dst[0x6c0] = uVar24;
  uVar22 = (uint8_t)(uVar19 + uVar25 + 1 >> 1);
  dst[0x6e0] = uVar22;
  dst[0x683] = (uint8_t)(uVar32 + uVar23 * 2 + ((uint)(uVar6 >> 0x10) & 0xff) + 2 >> 2);
  dst[0x682] = (uint8_t)(uVar31 + uVar32 * 2 + 2 + uVar23 >> 2);
  uVar17 = (uint8_t)(uVar26 + uVar31 * 2 + 2 + uVar32 >> 2);
  dst[0x6a3] = uVar17;
  dst[0x681] = uVar17;
  uVar17 = (uint8_t)(uVar27 + uVar26 * 2 + uVar31 + 2 >> 2);
  dst[0x6c3] = uVar17;
  dst[0x6a1] = uVar17;
  dst[0x6e3] = uVar29;
  dst[0x6c1] = uVar29;
  uVar17 = (uint8_t)(iVar18 + uVar25 >> 2);
  dst[0x6e1] = uVar17;
  dst[0x684] = uVar28;
  dst[0x6a4] = uVar24;
  dst[0x686] = uVar24;
  dst[0x6c4] = uVar22;
  dst[0x6a6] = uVar22;
  dst[0x685] = (uint8_t)uVar30;
  dst[0x6a5] = uVar17;
  dst[0x687] = uVar17;
  uVar17 = (uint8_t)(uVar19 + uVar25 * 3 + 2 >> 2);
  dst[0x6c5] = uVar17;
  dst[0x6a7] = uVar17;
  auVar34 = pshuflw(ZEXT216(CONCAT11(bVar3,bVar3)),ZEXT216(CONCAT11(bVar3,bVar3)),0);
  *(int *)(dst + 0x6e4) = auVar34._0_4_;
  dst[0x6c6] = bVar3;
  dst[0x6c7] = bVar3;
  return;
}

Assistant:

static void Intra4Preds_SSE2(uint8_t* WEBP_RESTRICT dst,
                             const uint8_t* WEBP_RESTRICT top) {
  DC4_SSE2(I4DC4 + dst, top);
  TM4_SSE2(I4TM4 + dst, top);
  VE4_SSE2(I4VE4 + dst, top);
  HE4_SSE2(I4HE4 + dst, top);
  RD4_SSE2(I4RD4 + dst, top);
  VR4_SSE2(I4VR4 + dst, top);
  LD4_SSE2(I4LD4 + dst, top);
  VL4_SSE2(I4VL4 + dst, top);
  HD4_SSE2(I4HD4 + dst, top);
  HU4_SSE2(I4HU4 + dst, top);
}